

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::LoadIntLoadResidual_Mv
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this,ChVectorDynamic<> *R,
          ChVectorDynamic<> *w,double c)

{
  shared_ptr<chrono::ChLoadableU> *__r;
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  uint uVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  LhsNested *pLVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChVectorDynamic<> grouped_cMv;
  ChVectorDynamic<> grouped_w;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_e8;
  ulong local_b0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_a8;
  double local_a0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *local_98;
  Matrix<double,__1,_1,_0,__1,_1> local_90;
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *local_70;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *local_68;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_60;
  
  if (*(long *)&this->field_0x38 != 0) {
    local_a8 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w;
    local_98 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)c;
    local_68 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R;
    local_e8.m_lhs._0_4_ = (**(code **)(*(long *)this + 0x38))();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_80,(int *)&local_e8);
    local_e8.m_lhs._0_4_ = (**(code **)(*(long *)this + 0x38))(this);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_90,(int *)&local_e8);
    __r = &(this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable;
    uVar7 = 0;
    iVar8 = 0;
    local_70 = this;
    while( true ) {
      pLVar10 = &local_e8.m_lhs.m_lhs;
      std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChLoadableU,void>
                ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                 &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
      iVar3 = (**(code **)(*(long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_) + 0x40))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pLVar10);
      if (iVar3 <= iVar8) break;
      std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChLoadableU,void>
                ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                 &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
      cVar2 = (**(code **)(*(long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_) + 0x58))
                        ((long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_),iVar8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pLVar10);
      if (cVar2 != '\0') {
        std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChLoadableU,void>
                  ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                   &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
        iVar3 = (**(code **)(*(long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_) + 0x48))
                          ((long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_),iVar8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.m_lhs.m_lhs);
        uVar9 = 0;
        local_b0 = uVar7;
        while( true ) {
          std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChLoadableU,void>
                    ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                     &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
          uVar4 = (**(code **)(*(long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_) + 0x50))
                            ((long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_),iVar8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.m_lhs.m_lhs);
          if (uVar4 <= uVar9) break;
          pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                             (local_a8,(ulong)(uint)(iVar3 + (int)uVar9));
          local_a0 = *pdVar5;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &local_80,uVar7 + uVar9 & 0xffffffff);
          uVar9 = uVar9 + 1;
          *pSVar6 = local_a0;
        }
        uVar7 = (ulong)(uint)((int)local_b0 + (int)uVar9);
      }
      iVar8 = iVar8 + 1;
    }
    Eigen::operator*(&local_60,(double *)&local_98,
                     (StorageBaseType *)(*(long *)&local_70->field_0x38 + 0x68));
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
    ::Product(&local_e8,&local_60,&local_80);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              (&local_90,&local_e8);
    uVar7 = 0;
    iVar8 = 0;
    while( true ) {
      pLVar10 = &local_e8.m_lhs.m_lhs;
      std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChLoadableU,void>
                ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                 &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
      iVar3 = (**(code **)(*(long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_) + 0x40))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pLVar10);
      if (iVar3 <= iVar8) break;
      std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChLoadableU,void>
                ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                 &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
      cVar2 = (**(code **)(*(long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_) + 0x58))
                        ((long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_),iVar8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pLVar10);
      if (cVar2 != '\0') {
        std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChLoadableU,void>
                  ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                   &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
        iVar3 = (**(code **)(*(long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_) + 0x48))
                          ((long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_),iVar8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.m_lhs.m_lhs);
        uVar9 = 0;
        local_b0 = uVar7;
        while( true ) {
          std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<chrono::ChLoadableU,void>
                    ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
                     &__r->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>);
          uVar4 = (**(code **)(*(long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_) + 0x50))
                            ((long *)CONCAT44(local_e8.m_lhs._4_4_,local_e8.m_lhs._0_4_),iVar8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8.m_lhs.m_lhs);
          if (uVar4 <= uVar9) break;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &local_90,uVar7 + uVar9 & 0xffffffff);
          local_a0 = *pSVar6;
          local_a8 = local_98;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             (local_68,(ulong)(uint)(iVar3 + (int)uVar9));
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_a0;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_a8;
          uVar9 = uVar9 + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *pSVar6;
          auVar1 = vfmadd213sd_fma(auVar12,auVar11,auVar1);
          *pSVar6 = auVar1._0_8_;
        }
        uVar7 = (ulong)(uint)((int)local_b0 + (int)uVar9);
      }
      iVar8 = iVar8 + 1;
    }
    Eigen::internal::handmade_aligned_free
              (local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, double c) {
    if (!this->jacobians)
        return;
    // fetch w as a contiguous vector
    ChVectorDynamic<> grouped_w(this->LoadGet_ndof_w());
    ChVectorDynamic<> grouped_cMv(this->LoadGet_ndof_w());
    unsigned int rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                grouped_w(rowQ) = w(row + moffset);
                ++rowQ;
            }
        }
    }
    // do computation R=c*M*v
    grouped_cMv = c * this->jacobians->M * grouped_w;
    rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                R(row + moffset) += grouped_cMv(rowQ) * c;
                ++rowQ;
            }
        }
    }
}